

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

tm_conflict * http_gmtime(time_t timer,tm_conflict *tmbuf)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  time_t timer_local;
  
  if (timer < 0) {
    timer_local = timer;
    tmbuf = (tm_conflict *)gmtime_r(&timer_local,(tm *)tmbuf);
  }
  else {
    tmbuf->tm_mon = 0;
    tmbuf->tm_year = 0x46;
    tmbuf->tm_hour = 0;
    tmbuf->tm_mday = 0;
    *(undefined8 *)&tmbuf->tm_isdst = 0;
    tmbuf->tm_gmtoff = 0;
    tmbuf->tm_zone = (char *)0x0;
    iVar4 = (int)((ulong)timer / 0x3c);
    tmbuf->tm_sec = iVar4 * -0x3c + (int)timer;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = timer;
    iVar10 = SUB164(auVar2 / ZEXT816(0xe10),0);
    tmbuf->tm_min = iVar10 * -0x3c + iVar4;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = timer;
    uVar5 = SUB168(auVar3 / ZEXT816(0x15180),0);
    tmbuf->tm_hour = SUB164(auVar3 / ZEXT816(0x15180),0) * -0x18 + iVar10;
    tmbuf->tm_wday = (int)((uVar5 + 4) % 7);
    uVar8 = 1;
    iVar4 = 0x1d6;
    for (; 0x23ab0 < uVar5; uVar5 = uVar5 - 0x23ab1) {
      tmbuf->tm_year = iVar4;
      uVar8 = uVar8 + 4;
      iVar4 = iVar4 + 400;
    }
    iVar4 = iVar4 + -300;
    for (; 0x8eab < (long)uVar5; uVar5 = (uVar5 - (uVar1 == 0)) - 0x8eac) {
      uVar1 = uVar8 & 3;
      tmbuf->tm_year = iVar4;
      iVar4 = iVar4 + 100;
      uVar8 = uVar8 + 1;
    }
    uVar8 = iVar4 - 100;
    for (; 0x2da7 < (long)uVar5; uVar5 = uVar5 - 0x2da8) {
      uVar8 = uVar8 + 0x20;
      tmbuf->tm_year = uVar8;
    }
    for (; 0xb69 < (long)uVar5; uVar5 = uVar5 - 0xb6a) {
      uVar8 = uVar8 + 8;
      tmbuf->tm_year = uVar8;
    }
    for (; 0x5b4 < (long)uVar5; uVar5 = uVar5 - 0x5b5) {
      uVar8 = uVar8 + 4;
      tmbuf->tm_year = uVar8;
    }
    while (0x16c < (long)uVar5) {
      uVar1 = uVar8 + 1;
      tmbuf->tm_year = uVar1;
      if ((uVar1 & 3) == 0) {
        if (uVar5 == 0x16d) {
          tmbuf->tm_year = uVar8;
          lVar7 = 0x16e;
          goto LAB_00142a7c;
        }
        uVar5 = uVar5 - 0x16e;
        uVar8 = uVar1;
      }
      else {
        uVar5 = uVar5 - 0x16d;
        uVar8 = uVar1;
      }
    }
    lVar7 = uVar5 + 1;
LAB_00142a7c:
    tmbuf->tm_yday = (int)lVar7;
    if ((uVar8 & 3) == 1) {
      lVar6 = 0;
      while ((lVar6 != 0xc &&
             (lVar9 = lVar7 - (ulong)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"
                                     [lVar6],
             lVar9 != 0 &&
             (long)(ulong)"\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f"
                          [lVar6] <= lVar7))) {
        tmbuf->tm_mon = tmbuf->tm_mon + 1;
        lVar6 = lVar6 + 1;
        lVar7 = lVar9;
      }
    }
    else {
      lVar6 = -0xc;
      while ((lVar6 != 0 &&
             (lVar9 = lVar7 - (ulong)(byte)"FATAL: HTTP SSL/TLS required but unavailable!"[lVar6],
             lVar9 != 0 &&
             (long)(ulong)(byte)"FATAL: HTTP SSL/TLS required but unavailable!"[lVar6] <= lVar7))) {
        tmbuf->tm_mon = tmbuf->tm_mon + 1;
        lVar6 = lVar6 + 1;
        lVar7 = lVar9;
      }
    }
    tmbuf->tm_mday = (int)lVar7;
  }
  return tmbuf;
}

Assistant:

struct tm *http_gmtime(time_t timer, struct tm *tmbuf) {
  // static char* DAYS[] = {"Sun", "Mon", "Tue", "Wed", "Thu", "Fri",
  // "Sat"}; static char * Months = {  "Jan", "Feb", "Mar", "Apr", "May",
  // "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec"};
  static const uint8_t month_len[] = {
      31, 28, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31, // nonleap year
      31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31  // leap year
  };
  if (timer < 0)
    return gmtime_r(&timer, tmbuf);
  ssize_t a, b;
#if HAVE_TM_TM_ZONE
  *tmbuf = (struct tm){
      .tm_isdst = 0,
      .tm_year = 70, // tm_year == The number of years since 1900
      .tm_mon = 0,
      .tm_zone = "UTC",
  };
#else
  *tmbuf = (struct tm){
      .tm_isdst = 0,
      .tm_year = 70, // tm_year == The number of years since 1900
      .tm_mon = 0,
  };
#endif
  // for seconds up to weekdays, we build up, as small values clean up
  // larger values.
  a = (ssize_t)timer;
  b = a / 60;
  tmbuf->tm_sec = a - (b * 60);
  a = b / 60;
  tmbuf->tm_min = b - (a * 60);
  b = a / 24;
  tmbuf->tm_hour = a - (b * 24);
  // day of epoch was a thursday. Add + 4 so sunday == 0...
  tmbuf->tm_wday = (b + 4) % 7;
// tmp == number of days since epoch
#define DAYS_PER_400_YEARS ((400 * 365) + 97)
  while (b >= DAYS_PER_400_YEARS) {
    tmbuf->tm_year += 400;
    b -= DAYS_PER_400_YEARS;
  }
#undef DAYS_PER_400_YEARS
#define DAYS_PER_100_YEARS ((100 * 365) + 24)
  while (b >= DAYS_PER_100_YEARS) {
    tmbuf->tm_year += 100;
    b -= DAYS_PER_100_YEARS;
    if (((tmbuf->tm_year / 100) & 3) ==
        0) // leap century divisable by 400 => add leap
      --b;
  }
#undef DAYS_PER_100_YEARS
#define DAYS_PER_32_YEARS ((32 * 365) + 8)
  while (b >= DAYS_PER_32_YEARS) {
    tmbuf->tm_year += 32;
    b -= DAYS_PER_32_YEARS;
  }
#undef DAYS_PER_32_YEARS
#define DAYS_PER_8_YEARS ((8 * 365) + 2)
  while (b >= DAYS_PER_8_YEARS) {
    tmbuf->tm_year += 8;
    b -= DAYS_PER_8_YEARS;
  }
#undef DAYS_PER_8_YEARS
#define DAYS_PER_4_YEARS ((4 * 365) + 1)
  while (b >= DAYS_PER_4_YEARS) {
    tmbuf->tm_year += 4;
    b -= DAYS_PER_4_YEARS;
  }
#undef DAYS_PER_4_YEARS
  while (b >= 365) {
    tmbuf->tm_year += 1;
    b -= 365;
    if ((tmbuf->tm_year & 3) == 0) { // leap year
      if (b > 0) {
        --b;
        continue;
      } else {
        b += 365;
        --tmbuf->tm_year;
        break;
      }
    }
  }
  b++; /* day 1 of the year is 1, not 0. */
  tmbuf->tm_yday = b;
  if ((tmbuf->tm_year & 3) == 1) {
    // regular year
    for (size_t i = 0; i < 12; i++) {
      if (b <= month_len[i])
        break;
      b -= month_len[i];
      ++tmbuf->tm_mon;
    }
  } else {
    // leap year
    for (size_t i = 12; i < 24; i++) {
      if (b <= month_len[i])
        break;
      b -= month_len[i];
      ++tmbuf->tm_mon;
    }
  }
  tmbuf->tm_mday = b;
  return tmbuf;
}